

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O1

void __thiscall wabt::WastLexer::ReadWhitespace(WastLexer *this)

{
  byte *pbVar1;
  byte *pbVar2;
  int iVar3;
  uint uVar4;
  
  pbVar1 = (byte *)this->buffer_end_;
  pbVar2 = (byte *)this->cursor_;
  iVar3 = this->line_;
LAB_00156b83:
  do {
    uVar4 = 0xffffffff;
    if (pbVar2 < pbVar1) {
      uVar4 = (uint)*pbVar2;
    }
    do {
      if ((int)uVar4 < 0xd) {
        if (uVar4 != 9) {
          if (uVar4 != 10) {
            return;
          }
          if (pbVar2 < pbVar1) {
            pbVar2 = pbVar2 + 1;
            this->cursor_ = (char *)pbVar2;
          }
          iVar3 = iVar3 + 1;
          this->line_ = iVar3;
          this->line_start_ = (char *)pbVar2;
          goto LAB_00156b83;
        }
      }
      else if ((uVar4 != 0x20) && (uVar4 != 0xd)) {
        return;
      }
      uVar4 = 0xffffffff;
    } while (pbVar1 <= pbVar2);
    pbVar2 = pbVar2 + 1;
    this->cursor_ = (char *)pbVar2;
  } while( true );
}

Assistant:

void WastLexer::ReadWhitespace() {
  while (true) {
    switch (PeekChar()) {
      case ' ':
      case '\t':
      case '\r':
        ReadChar();
        break;

      case '\n':
        ReadChar();
        Newline();
        break;

      default:
        return;
    }
  }
}